

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeShaderBuiltinVarTests.cpp
# Opt level: O1

int __thiscall
vkt::compute::anon_unknown_0::ComputeShaderBuiltinVarTests::init
          (ComputeShaderBuiltinVarTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  ComputeBuiltinVarCase *pCVar1;
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  *pvVar2;
  value_type local_48;
  
  pCVar1 = (ComputeBuiltinVarCase *)operator_new(0xb0);
  ComputeBuiltinVarCase::ComputeBuiltinVarCase
            (pCVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"num_work_groups",
             "gl_NumWorkGroups",TYPE_UINT_VEC3);
  (pCVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ComputeBuiltinVarCase_00d61c30;
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 1;
  local_48.m_numWorkGroups.m_data[1] = 1;
  local_48.m_numWorkGroups.m_data[2] = 1;
  pvVar2 = &pCVar1->m_subCases;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 0x34;
  local_48.m_numWorkGroups.m_data[1] = 1;
  local_48.m_numWorkGroups.m_data[2] = 1;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 1;
  local_48.m_numWorkGroups.m_data[1] = 0x27;
  local_48.m_numWorkGroups.m_data[2] = 1;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 1;
  local_48.m_numWorkGroups.m_data[1] = 1;
  local_48.m_numWorkGroups.m_data[2] = 0x4e;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 4;
  local_48.m_numWorkGroups.m_data[1] = 7;
  local_48.m_numWorkGroups.m_data[2] = 0xb;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 2;
  local_48.m_localSize.m_data[1] = 3;
  local_48.m_localSize.m_data[2] = 4;
  local_48.m_numWorkGroups.m_data[0] = 4;
  local_48.m_numWorkGroups.m_data[1] = 7;
  local_48.m_numWorkGroups.m_data[2] = 0xb;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ComputeBuiltinVarCase *)operator_new(0xb0);
  ComputeBuiltinVarCase::ComputeBuiltinVarCase
            (pCVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"work_group_size",
             "gl_WorkGroupSize",TYPE_UINT_VEC3);
  (pCVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ComputeBuiltinVarCase_00d61d40;
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 1;
  local_48.m_numWorkGroups.m_data[1] = 1;
  local_48.m_numWorkGroups.m_data[2] = 1;
  pvVar2 = &pCVar1->m_subCases;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 2;
  local_48.m_numWorkGroups.m_data[1] = 7;
  local_48.m_numWorkGroups.m_data[2] = 3;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 2;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 1;
  local_48.m_numWorkGroups.m_data[1] = 1;
  local_48.m_numWorkGroups.m_data[2] = 1;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 2;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 1;
  local_48.m_numWorkGroups.m_data[1] = 3;
  local_48.m_numWorkGroups.m_data[2] = 5;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 3;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 1;
  local_48.m_numWorkGroups.m_data[1] = 1;
  local_48.m_numWorkGroups.m_data[2] = 1;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 7;
  local_48.m_numWorkGroups.m_data[0] = 1;
  local_48.m_numWorkGroups.m_data[1] = 1;
  local_48.m_numWorkGroups.m_data[2] = 1;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 7;
  local_48.m_numWorkGroups.m_data[0] = 3;
  local_48.m_numWorkGroups.m_data[1] = 3;
  local_48.m_numWorkGroups.m_data[2] = 1;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 10;
  local_48.m_localSize.m_data[1] = 3;
  local_48.m_localSize.m_data[2] = 4;
  local_48.m_numWorkGroups.m_data[0] = 1;
  local_48.m_numWorkGroups.m_data[1] = 1;
  local_48.m_numWorkGroups.m_data[2] = 1;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 10;
  local_48.m_localSize.m_data[1] = 3;
  local_48.m_localSize.m_data[2] = 4;
  local_48.m_numWorkGroups.m_data[0] = 3;
  local_48.m_numWorkGroups.m_data[1] = 1;
  local_48.m_numWorkGroups.m_data[2] = 2;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ComputeBuiltinVarCase *)operator_new(0xb0);
  ComputeBuiltinVarCase::ComputeBuiltinVarCase
            (pCVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"work_group_id",
             "gl_WorkGroupID",TYPE_UINT_VEC3);
  (pCVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ComputeBuiltinVarCase_00d61da8;
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 1;
  local_48.m_numWorkGroups.m_data[1] = 1;
  local_48.m_numWorkGroups.m_data[2] = 1;
  pvVar2 = &pCVar1->m_subCases;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 0x34;
  local_48.m_numWorkGroups.m_data[1] = 1;
  local_48.m_numWorkGroups.m_data[2] = 1;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 1;
  local_48.m_numWorkGroups.m_data[1] = 0x27;
  local_48.m_numWorkGroups.m_data[2] = 1;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 1;
  local_48.m_numWorkGroups.m_data[1] = 1;
  local_48.m_numWorkGroups.m_data[2] = 0x4e;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 4;
  local_48.m_numWorkGroups.m_data[1] = 7;
  local_48.m_numWorkGroups.m_data[2] = 0xb;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 2;
  local_48.m_localSize.m_data[1] = 3;
  local_48.m_localSize.m_data[2] = 4;
  local_48.m_numWorkGroups.m_data[0] = 4;
  local_48.m_numWorkGroups.m_data[1] = 7;
  local_48.m_numWorkGroups.m_data[2] = 0xb;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ComputeBuiltinVarCase *)operator_new(0xb0);
  ComputeBuiltinVarCase::ComputeBuiltinVarCase
            (pCVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"local_invocation_id",
             "gl_LocalInvocationID",TYPE_UINT_VEC3);
  (pCVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ComputeBuiltinVarCase_00d61e10;
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 1;
  local_48.m_numWorkGroups.m_data[1] = 1;
  local_48.m_numWorkGroups.m_data[2] = 1;
  pvVar2 = &pCVar1->m_subCases;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 2;
  local_48.m_numWorkGroups.m_data[1] = 7;
  local_48.m_numWorkGroups.m_data[2] = 3;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 2;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 1;
  local_48.m_numWorkGroups.m_data[1] = 1;
  local_48.m_numWorkGroups.m_data[2] = 1;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 2;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 1;
  local_48.m_numWorkGroups.m_data[1] = 3;
  local_48.m_numWorkGroups.m_data[2] = 5;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 3;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 1;
  local_48.m_numWorkGroups.m_data[1] = 1;
  local_48.m_numWorkGroups.m_data[2] = 1;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 7;
  local_48.m_numWorkGroups.m_data[0] = 1;
  local_48.m_numWorkGroups.m_data[1] = 1;
  local_48.m_numWorkGroups.m_data[2] = 1;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 7;
  local_48.m_numWorkGroups.m_data[0] = 3;
  local_48.m_numWorkGroups.m_data[1] = 3;
  local_48.m_numWorkGroups.m_data[2] = 1;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 10;
  local_48.m_localSize.m_data[1] = 3;
  local_48.m_localSize.m_data[2] = 4;
  local_48.m_numWorkGroups.m_data[0] = 1;
  local_48.m_numWorkGroups.m_data[1] = 1;
  local_48.m_numWorkGroups.m_data[2] = 1;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 10;
  local_48.m_localSize.m_data[1] = 3;
  local_48.m_localSize.m_data[2] = 4;
  local_48.m_numWorkGroups.m_data[0] = 3;
  local_48.m_numWorkGroups.m_data[1] = 1;
  local_48.m_numWorkGroups.m_data[2] = 2;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ComputeBuiltinVarCase *)operator_new(0xb0);
  ComputeBuiltinVarCase::ComputeBuiltinVarCase
            (pCVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"global_invocation_id",
             "gl_GlobalInvocationID",TYPE_UINT_VEC3);
  (pCVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ComputeBuiltinVarCase_00d61e78;
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 1;
  local_48.m_numWorkGroups.m_data[1] = 1;
  local_48.m_numWorkGroups.m_data[2] = 1;
  pvVar2 = &pCVar1->m_subCases;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 0x34;
  local_48.m_numWorkGroups.m_data[1] = 1;
  local_48.m_numWorkGroups.m_data[2] = 1;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 1;
  local_48.m_numWorkGroups.m_data[1] = 0x27;
  local_48.m_numWorkGroups.m_data[2] = 1;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 1;
  local_48.m_numWorkGroups.m_data[1] = 1;
  local_48.m_numWorkGroups.m_data[2] = 0x4e;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 4;
  local_48.m_numWorkGroups.m_data[1] = 7;
  local_48.m_numWorkGroups.m_data[2] = 0xb;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 2;
  local_48.m_localSize.m_data[1] = 3;
  local_48.m_localSize.m_data[2] = 4;
  local_48.m_numWorkGroups.m_data[0] = 4;
  local_48.m_numWorkGroups.m_data[1] = 7;
  local_48.m_numWorkGroups.m_data[2] = 0xb;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 10;
  local_48.m_localSize.m_data[1] = 3;
  local_48.m_localSize.m_data[2] = 4;
  local_48.m_numWorkGroups.m_data[0] = 1;
  local_48.m_numWorkGroups.m_data[1] = 1;
  local_48.m_numWorkGroups.m_data[2] = 1;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 10;
  local_48.m_localSize.m_data[1] = 3;
  local_48.m_localSize.m_data[2] = 4;
  local_48.m_numWorkGroups.m_data[0] = 3;
  local_48.m_numWorkGroups.m_data[1] = 1;
  local_48.m_numWorkGroups.m_data[2] = 2;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (ComputeBuiltinVarCase *)operator_new(0xb0);
  ComputeBuiltinVarCase::ComputeBuiltinVarCase
            (pCVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"local_invocation_index",
             "gl_LocalInvocationIndex",TYPE_UINT);
  (pCVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ComputeBuiltinVarCase_00d61ee0;
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 1;
  local_48.m_numWorkGroups.m_data[1] = 1;
  local_48.m_numWorkGroups.m_data[2] = 1;
  pvVar2 = &pCVar1->m_subCases;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 1;
  local_48.m_numWorkGroups.m_data[1] = 0x27;
  local_48.m_numWorkGroups.m_data[2] = 1;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 1;
  local_48.m_localSize.m_data[1] = 1;
  local_48.m_localSize.m_data[2] = 1;
  local_48.m_numWorkGroups.m_data[0] = 4;
  local_48.m_numWorkGroups.m_data[1] = 7;
  local_48.m_numWorkGroups.m_data[2] = 0xb;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 2;
  local_48.m_localSize.m_data[1] = 3;
  local_48.m_localSize.m_data[2] = 4;
  local_48.m_numWorkGroups.m_data[0] = 4;
  local_48.m_numWorkGroups.m_data[1] = 7;
  local_48.m_numWorkGroups.m_data[2] = 0xb;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 10;
  local_48.m_localSize.m_data[1] = 3;
  local_48.m_localSize.m_data[2] = 4;
  local_48.m_numWorkGroups.m_data[0] = 1;
  local_48.m_numWorkGroups.m_data[1] = 1;
  local_48.m_numWorkGroups.m_data[2] = 1;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  local_48.m_localSize.m_data[0] = 10;
  local_48.m_localSize.m_data[1] = 3;
  local_48.m_localSize.m_data[2] = 4;
  local_48.m_numWorkGroups.m_data[0] = 3;
  local_48.m_numWorkGroups.m_data[1] = 1;
  local_48.m_numWorkGroups.m_data[2] = 2;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar2,&local_48);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  return extraout_EAX;
}

Assistant:

void ComputeShaderBuiltinVarTests::init (void)
{
	addChild(new NumWorkGroupsCase(this->getTestContext()));
	addChild(new WorkGroupSizeCase(this->getTestContext()));
	addChild(new WorkGroupIDCase(this->getTestContext()));
	addChild(new LocalInvocationIDCase(this->getTestContext()));
	addChild(new GlobalInvocationIDCase(this->getTestContext()));
	addChild(new LocalInvocationIndexCase(this->getTestContext()));
}